

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O2

string * MeshLib::Trait::getTraitValue
                   (string *__return_storage_ptr__,string *traitString,string *traitName)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  string isolatedTraitString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48," ",traitName);
  std::operator+(&isolatedTraitString,&local_48,"=(");
  iVar1 = std::__cxx11::string::find((string *)traitString,(ulong)&isolatedTraitString);
  std::__cxx11::string::~string((string *)&isolatedTraitString);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&isolatedTraitString,traitName,"=(");
  iVar2 = std::__cxx11::string::find((string *)traitString,(ulong)&isolatedTraitString);
  std::__cxx11::string::~string((string *)&isolatedTraitString);
  if (iVar1 == -1 && iVar2 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&isolatedTraitString,(ulong)traitString);
    iVar1 = std::__cxx11::string::find_first_of((char *)&isolatedTraitString,0x1152fa);
    std::__cxx11::string::find_first_of((char *)&isolatedTraitString,0x1152b4);
    if (iVar1 == -1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: String missing parenthesis: ");
      poVar3 = std::operator<<(poVar3,(string *)&isolatedTraitString);
      std::endl<char,std::char_traits<char>>(poVar3);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&isolatedTraitString);
    }
    std::__cxx11::string::~string((string *)&isolatedTraitString);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Trait::getTraitValue(std::string &traitString, std::string &traitName)
{
	int sp, ep, sfp;
	sfp = (int)traitString.find(" "+traitName+"=(");
	sp = (int)traitString.find(traitName+"=(");
	if(sp == 0 || sfp != (int)std::string::npos)
	{
		int temp;
		if( sp == 0 ) temp = sp;
		else temp = sfp;

		std::string isolatedTraitString(traitString.substr(temp));
		sp = (int)isolatedTraitString.find_first_of("(");
		ep = (int)isolatedTraitString.find_first_of(")");
		if(sp != (int)std::string::npos)
		{
			// the value was found
			sp++;
			return isolatedTraitString.substr(sp, ep-sp);
		}
		else
		{
			std::cerr << "ERROR: String missing parenthesis: " << isolatedTraitString << std::endl;
			return std::string();
		}
	}

	return std::string();
}